

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O3

void RigidBodyDynamics::SolveContactSystemRangeSpaceSparse
               (Model *model,MatrixNd *H,MatrixNd *G,VectorNd *c,VectorNd *gamma,VectorNd *qddot,
               VectorNd *lambda,MatrixNd *K,VectorNd *a,LinearSolver linear_solver)

{
  double **ppdVar1;
  double dVar2;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *pLVar3;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *x;
  undefined8 *puVar4;
  double *pdVar5;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar11;
  long lVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  VectorNd z;
  assign_op<double,_double> local_c9;
  SrcXprType local_c8;
  DenseStorage<double,__1,__1,__1,_0> local_b8;
  MatrixNd *local_98;
  DenseStorage<double,__1,__1,_1,_0> *local_90;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_88;
  VectorNd *local_80;
  DenseStorage<double,__1,__1,_1,_0> local_78;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_68;
  ulong local_40;
  ulong local_38;
  
  local_90 = (DenseStorage<double,__1,__1,_1,_0> *)c;
  local_88 = &qddot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  local_80 = gamma;
  Math::SparseFactorizeLTL(model,H);
  local_b8.m_data = (double *)0x0;
  local_b8.m_rows = 0;
  local_b8.m_cols = 0;
  lVar7 = (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar12 = (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_98 = G;
  if (lVar12 != 0 || lVar7 != 0) {
    pdVar8 = (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    if ((lVar12 != 0 && lVar7 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar7),0) < lVar12)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = std::operator<<;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_b8,lVar12 * lVar7,lVar12,lVar7);
    if (0 < local_b8.m_cols) {
      lVar12 = 0;
      pdVar5 = local_b8.m_data;
      do {
        if (0 < local_b8.m_rows) {
          lVar15 = 0;
          pdVar13 = pdVar8;
          do {
            pdVar5[lVar15] = *pdVar13;
            lVar15 = lVar15 + 1;
            pdVar13 = pdVar13 + lVar7;
          } while (local_b8.m_rows != lVar15);
        }
        lVar12 = lVar12 + 1;
        pdVar8 = pdVar8 + 1;
        pdVar5 = pdVar5 + local_b8.m_rows;
      } while (lVar12 != local_b8.m_cols);
      uVar9 = 0;
      do {
        local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
        .m_data = local_b8.m_data + local_b8.m_rows * uVar9;
        local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
        .m_rows = local_b8.m_rows;
        local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
        .m_cols = 1;
        local_68.m_l1_norm = (RealScalar)&local_b8;
        local_68.m_isInitialized = false;
        local_68._33_3_ = 0;
        local_68.m_info = Success;
        local_38 = local_b8.m_rows;
        local_40 = uVar9;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                    *)&local_68);
        Math::SparseSolveLTx(model,H,(VectorNd *)&local_c8);
        pdVar8 = local_b8.m_data + uVar9 * local_b8.m_rows;
        if (((ulong)pdVar8 & 7) == 0) {
          uVar10 = (ulong)((uint)((ulong)pdVar8 >> 3) & 1);
          if (local_b8.m_rows <= (long)uVar10) {
            uVar10 = local_b8.m_rows;
          }
          if (0 < (long)uVar10) {
            *pdVar8 = (double)((local_c8.m_dec)->m_matrix).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data;
          }
          uVar14 = local_b8.m_rows - uVar10 & 0xfffffffffffffffe;
          lVar7 = uVar10 + uVar14;
          if (0 < (long)uVar14) {
            do {
              ppdVar1 = &((local_c8.m_dec)->m_matrix).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_data + uVar10;
              dVar2 = (double)ppdVar1[1];
              local_b8.m_data[uVar10 + local_b8.m_rows * uVar9] = (double)*ppdVar1;
              (local_b8.m_data + uVar10 + local_b8.m_rows * uVar9)[1] = dVar2;
              uVar10 = uVar10 + 2;
            } while ((long)uVar10 < lVar7);
          }
          if (lVar7 < local_b8.m_rows) {
            do {
              local_b8.m_data[local_b8.m_rows * uVar9 + lVar7] =
                   (double)(&((local_c8.m_dec)->m_matrix).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data)[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 < local_b8.m_rows);
          }
        }
        else if (0 < local_b8.m_rows) {
          lVar7 = 0;
          do {
            local_b8.m_data[lVar7 + local_b8.m_rows * uVar9] =
                 (double)(&((local_c8.m_dec)->m_matrix).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data)[lVar7];
            lVar7 = lVar7 + 1;
          } while (local_b8.m_rows != lVar7);
        }
        free(local_c8.m_dec);
        uVar9 = (ulong)((int)uVar9 + 1);
      } while ((long)uVar9 < local_b8.m_cols);
    }
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_78,local_90);
  Math::SparseSolveLTx(model,H,(VectorNd *)&local_78);
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)&local_b8;
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = (Index)&local_b8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
            (K,(Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                *)&local_68,(assign_op<double,_double> *)&local_c8,(type)0x0);
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)local_80;
  local_c8.m_dec = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)0x0;
  local_c8.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = (Index)&local_b8;
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = (Index)&local_78;
  Eigen::internal::
  assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::sub_assign_op<double,double>>
  ::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_c8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_68,&local_c9);
  pLVar3 = local_c8.m_dec;
  pMVar11 = local_c8.m_rhs;
  if ((Matrix<double,__1,_1,_0,__1,_1> *)
      (a->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      local_c8.m_rhs) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&a->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (Index)local_c8.m_rhs,1);
    pMVar11 = (Matrix<double,__1,_1,_0,__1,_1> *)
              (a->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  }
  pdVar8 = (a->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pMVar6 = (Matrix<double,__1,_1,_0,__1,_1> *)
           ((long)pMVar11 - ((long)pMVar11 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pMVar11) {
    lVar7 = 0;
    do {
      ppdVar1 = &(pLVar3->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_storage.m_data + lVar7;
      dVar2 = (double)ppdVar1[1];
      pdVar5 = pdVar8 + lVar7;
      *pdVar5 = (double)*ppdVar1;
      pdVar5[1] = dVar2;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)pMVar6);
  }
  if ((long)pMVar6 < (long)pMVar11) {
    do {
      pdVar8[(long)pMVar6] =
           (double)(&(pLVar3->m_matrix).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data)[(long)pMVar6];
      pMVar6 = (Matrix<double,__1,_1,_0,__1,_1> *)
               ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + 1);
    } while (pMVar11 != pMVar6);
  }
  free(local_c8.m_dec);
  Eigen::LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&local_68,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)K);
  local_c8.m_rhs = a;
  local_c8.m_dec = &local_68;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(lambda,&local_c8,&local_c9);
  free(local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)local_90;
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = (Index)local_98;
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = (Index)lambda;
  local_c8.m_dec = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)0x0;
  local_c8.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  Eigen::internal::
  assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
  ::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_c8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_68,&local_c9);
  x = local_88;
  pLVar3 = local_c8.m_dec;
  pMVar11 = local_c8.m_rhs;
  if ((Matrix<double,__1,_1,_0,__1,_1> *)(local_88->m_storage).m_rows != local_c8.m_rhs) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (local_88,(Index)local_c8.m_rhs,1);
    pMVar11 = (Matrix<double,__1,_1,_0,__1,_1> *)(x->m_storage).m_rows;
  }
  pdVar8 = (x->m_storage).m_data;
  pMVar6 = (Matrix<double,__1,_1,_0,__1,_1> *)
           ((long)pMVar11 - ((long)pMVar11 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pMVar11) {
    lVar7 = 0;
    do {
      ppdVar1 = &(pLVar3->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_storage.m_data + lVar7;
      dVar2 = (double)ppdVar1[1];
      pdVar5 = pdVar8 + lVar7;
      *pdVar5 = (double)*ppdVar1;
      pdVar5[1] = dVar2;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)pMVar6);
  }
  if ((long)pMVar6 < (long)pMVar11) {
    do {
      pdVar8[(long)pMVar6] =
           (double)(&(pLVar3->m_matrix).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data)[(long)pMVar6];
      pMVar6 = (Matrix<double,__1,_1,_0,__1,_1> *)
               ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + 1);
    } while (pMVar11 != pMVar6);
  }
  free(local_c8.m_dec);
  Math::SparseSolveLTx(model,H,(VectorNd *)x);
  Math::SparseSolveLx(model,H,(VectorNd *)x);
  free(local_78.m_data);
  free(local_b8.m_data);
  return;
}

Assistant:

RBDL_DLLAPI
void SolveContactSystemRangeSpaceSparse (
		Model &model, 
		Math::MatrixNd &H, 
		const Math::MatrixNd &G, 
		const Math::VectorNd &c, 
		const Math::VectorNd &gamma, 
		Math::VectorNd &qddot, 
		Math::VectorNd &lambda, 
		Math::MatrixNd &K, 
		Math::VectorNd &a,
		Math::LinearSolver linear_solver
	) {
	SparseFactorizeLTL (model, H);

	MatrixNd Y (G.transpose());

	for (unsigned int i = 0; i < Y.cols(); i++) {
		VectorNd Y_col = Y.block(0,i,Y.rows(),1);
		SparseSolveLTx (model, H, Y_col);
		Y.block(0,i,Y.rows(),1) = Y_col;
	}

	VectorNd z (c);
	SparseSolveLTx (model, H, z);

	K = Y.transpose() * Y;

	a = gamma - Y.transpose() * z;

	lambda = K.llt().solve(a);

	qddot = c + G.transpose() * lambda;
	SparseSolveLTx (model, H, qddot);
	SparseSolveLx (model, H, qddot);
}